

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
              _Bool *password_changed,char *netrcfile)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool local_108d;
  char local_1088 [4];
  int netrcbuffsize;
  char netrcbuffer [4096];
  _Bool done;
  char *tok_buf;
  char *tok;
  int state_our_login;
  byte local_5b;
  char state_password;
  char state_login;
  host_lookup_state state;
  _Bool password_alloc;
  _Bool login_alloc;
  _Bool specific_login;
  char *password;
  char *login;
  FILE *pFStack_40;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  _Bool *password_changed_local;
  _Bool *login_changed_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  login._4_4_ = 1;
  password = *loginp;
  _state = *passwordp;
  local_108d = false;
  if (password != (char *)0x0) {
    local_108d = *password != '\0';
  }
  state_login = local_108d;
  state_password = '\0';
  local_5b = 0;
  state_our_login = 0;
  tok._7_1_ = '\0';
  tok._6_1_ = '\0';
  tok._0_4_ = 0;
  file = (FILE *)netrcfile;
  netrcfile_local = password_changed;
  password_changed_local = login_changed;
  login_changed_local = (_Bool *)passwordp;
  passwordp_local = loginp;
  loginp_local = (char **)host;
  pFStack_40 = fopen64(netrcfile,"r");
  if (pFStack_40 == (FILE *)0x0) {
    return login._4_4_;
  }
  bVar1 = false;
  do {
    do {
      bVar4 = false;
      if (!bVar1) {
        pcVar3 = fgets(local_1088,0x1000,pFStack_40);
        bVar4 = pcVar3 != (char *)0x0;
      }
      if (!bVar4) {
LAB_00132e30:
        if (login._4_4_ == 0) {
          *password_changed_local = false;
          *netrcfile_local = '\0';
          if ((state_password & 1U) != 0) {
            if (*passwordp_local != (char *)0x0) {
              (*Curl_cfree)(*passwordp_local);
            }
            *passwordp_local = password;
            *password_changed_local = true;
          }
          if ((local_5b & 1) != 0) {
            if (*(long *)login_changed_local != 0) {
              (*Curl_cfree)(*(void **)login_changed_local);
            }
            *(char **)login_changed_local = _state;
            *netrcfile_local = '\x01';
          }
        }
        else {
          if ((state_password & 1U) != 0) {
            (*Curl_cfree)(password);
          }
          if ((local_5b & 1) != 0) {
            (*Curl_cfree)(_state);
          }
        }
        fclose(pFStack_40);
        return login._4_4_;
      }
      tok_buf = strtok_r(local_1088," \t\n",(char **)&stack0xffffffffffffff88);
    } while ((tok_buf != (char *)0x0) && (*tok_buf == '#'));
    while (tok_buf != (char *)0x0) {
      if ((((password != (char *)0x0) && (*password != '\0')) && (_state != (char *)0x0)) &&
         (*_state != '\0')) {
        bVar1 = true;
        break;
      }
      if (state_our_login == 0) {
        iVar2 = Curl_strcasecompare("machine",tok_buf);
        if (iVar2 == 0) {
          iVar2 = Curl_strcasecompare("default",tok_buf);
          if (iVar2 != 0) {
            state_our_login = 2;
            login._4_4_ = 0;
          }
        }
        else {
          state_our_login = 1;
        }
      }
      else if (state_our_login == 1) {
        iVar2 = Curl_strcasecompare((char *)loginp_local,tok_buf);
        if (iVar2 == 0) {
          state_our_login = 0;
        }
        else {
          state_our_login = 2;
          login._4_4_ = 0;
        }
      }
      else if (state_our_login == 2) {
        if (tok._7_1_ == '\0') {
          if (tok._6_1_ == '\0') {
            iVar2 = Curl_strcasecompare("login",tok_buf);
            if (iVar2 == 0) {
              iVar2 = Curl_strcasecompare("password",tok_buf);
              if (iVar2 == 0) {
                iVar2 = Curl_strcasecompare("machine",tok_buf);
                if (iVar2 != 0) {
                  state_our_login = 1;
                  tok._0_4_ = 0;
                }
              }
              else {
                tok._6_1_ = '\x01';
              }
            }
            else {
              tok._7_1_ = '\x01';
            }
          }
          else {
            if ((((int)tok != 0) || ((state_login & 1U) == 0)) &&
               ((_state == (char *)0x0 || (iVar2 = strcmp(_state,tok_buf), iVar2 != 0)))) {
              if ((local_5b & 1) != 0) {
                (*Curl_cfree)(_state);
                local_5b = 0;
              }
              _state = (*Curl_cstrdup)(tok_buf);
              if (_state == (char *)0x0) {
                login._4_4_ = -1;
                goto LAB_00132e30;
              }
              local_5b = 1;
            }
            tok._6_1_ = '\0';
          }
        }
        else {
          if ((state_login & 1U) == 0) {
            if ((password == (char *)0x0) || (iVar2 = strcmp(password,tok_buf), iVar2 != 0)) {
              if ((state_password & 1U) != 0) {
                (*Curl_cfree)(password);
                state_password = '\0';
              }
              password = (*Curl_cstrdup)(tok_buf);
              if (password == (char *)0x0) {
                login._4_4_ = -1;
                goto LAB_00132e30;
              }
              state_password = '\x01';
            }
          }
          else {
            tok._0_4_ = Curl_strcasecompare(password,tok_buf);
          }
          tok._7_1_ = '\0';
        }
      }
      tok_buf = strtok_r((char *)0x0," \t\n",(char **)&stack0xffffffffffffff88);
    }
  } while( true );
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      bool *login_changed,
                      bool *password_changed,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else if(!login || strcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
                && (!password || strcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      /* success */
      *login_changed = FALSE;
      *password_changed = FALSE;
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
        *login_changed = TRUE;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
        *password_changed = TRUE;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}